

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,BinaryExpression *bin_exp,void *data)

{
  uint uVar1;
  int end_register;
  int line;
  int iVar2;
  Function *this_00;
  SyntaxTree *pSVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  Instruction *pIVar8;
  ExpVarData_conflict left_data;
  ExpVarData_conflict right_data;
  int local_a0;
  _Any_data local_98 [2];
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  uVar1 = *data;
  end_register = *(int *)((long)data + 4);
  if ((int)uVar1 < end_register || end_register == -1) {
    this_00 = this->current_function_->function_;
    line = (bin_exp->op_token_).line_;
    iVar2 = (bin_exp->op_token_).token_;
    local_98[0]._0_4_ = uVar1;
    if ((iVar2 == 0x10e) || (iVar2 == 0x100)) {
      pSVar3 = (bin_exp->left_)._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      local_98[0]._4_4_ = uVar1 + 1;
      (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
      sVar6 = Function::AddInstruction
                        (this_00,(Instruction)
                                 ((uint)(iVar2 != 0x100) * 0x1000000 + (uVar1 & 0xff) * 0x10000 +
                                 0xf000000),line);
      local_78._4_4_ = uVar1 + 1;
      local_78._0_4_ = uVar1;
      pSVar3 = (bin_exp->right_)._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
      sVar7 = Function::OpCodeSize(this_00);
      local_a0 = (int)sVar6;
      pIVar8 = Function::GetMutableInstruction(this_00,(long)local_a0);
      *(short *)&pIVar8->opcode_ = (short)sVar7 - (short)sVar6;
    }
    else {
      uVar4 = uVar1 + 1;
      pSVar3 = (bin_exp->left_)._M_t.
               super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
               super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
               super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      local_98[0]._4_4_ = uVar4;
      (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
      if ((int)uVar4 < end_register && end_register != -1) {
        local_98[0]._4_4_ = uVar1 + 2;
        pSVar3 = (bin_exp->right_)._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        local_98[0]._0_4_ = uVar4;
        (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
      }
      else {
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        local_60 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1371:17)>
                   ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1371:17)>
                   ::_M_manager;
        local_50._12_4_ = 0;
        local_50._8_4_ = this->current_function_->register_id_;
        local_38 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1371:17)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1371:17)>
                   ::_M_manager;
        local_50._M_unused._M_object = this;
        Guard::Guard((Guard *)local_98,(function<void_()> *)&local_78,(function<void_()> *)&local_50
                    );
        std::_Function_base::~_Function_base((_Function_base *)&local_50);
        std::_Function_base::~_Function_base((_Function_base *)&local_78);
        uVar4 = GenerateRegisterId(this);
        local_78._4_4_ = uVar4 + 1;
        local_78._0_4_ = uVar4;
        pSVar3 = (bin_exp->right_)._M_t.
                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                 super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
        (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,this);
        Guard::~Guard((Guard *)local_98);
      }
      switch(iVar2) {
      case 0x25:
        uVar5 = 0x1b000000;
        break;
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2c:
      case 0x2e:
switchD_0016d002_caseD_26:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                      ,0x572,
                      "virtual void luna::CodeGenerateVisitor::Visit(BinaryExpression *, void *)");
      case 0x2a:
        uVar5 = 0x18000000;
        break;
      case 0x2b:
        uVar5 = 0x16000000;
        break;
      case 0x2d:
        uVar5 = 0x17000000;
        break;
      case 0x2f:
        uVar5 = 0x19000000;
        break;
      default:
        switch(iVar2) {
        case 0x118:
          uVar5 = 0x1f000000;
          break;
        case 0x119:
          uVar5 = 0x20000000;
          break;
        case 0x11a:
          uVar5 = 0x21000000;
          break;
        case 0x11b:
          uVar5 = 0x22000000;
          break;
        case 0x11c:
          uVar5 = 0x1c000000;
          break;
        default:
          if (iVar2 == 0x3c) {
            uVar5 = 0x1d000000;
          }
          else if (iVar2 == 0x3e) {
            uVar5 = 0x1e000000;
          }
          else {
            if (iVar2 != 0x5e) goto switchD_0016d002_caseD_26;
            uVar5 = 0x1a000000;
          }
        }
      }
      Function::AddInstruction
                (this_00,(Instruction)
                         (uVar4 & 0xff | (uVar1 & 0xff) << 8 | (uVar1 & 0xff) << 0x10 | uVar5),line)
      ;
    }
    FillRemainRegisterNil(this,uVar1 + 1,end_register,line);
  }
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(BinaryExpression *bin_exp, void *data)
    {
        auto exp_var_data = static_cast<ExpVarData *>(data);
        auto register_id = exp_var_data->start_register_;
        auto end_register = exp_var_data->end_register_;

        if (end_register != EXP_VALUE_COUNT_ANY && register_id >= end_register)
            return ;

        auto function = GetCurrentFunction();
        auto line = bin_exp->op_token_.line_;
        auto token = bin_exp->op_token_.token_;
        if (token == Token_And || token == Token_Or)
        {
            // Calculate left expression
            ExpVarData left_data{ register_id, register_id + 1 };
            bin_exp->left_->Accept(this, &left_data);

            // Do not calculate right expression when the result of left expression
            // satisfy semantics of operator
            auto op_type = token == Token_And ? OpType_JmpFalse : OpType_JmpTrue;
            auto instruction = Instruction::AsBxCode(op_type, register_id, 0);
            int index = function->AddInstruction(instruction, line);

            // Calculate right expression
            ExpVarData right_data{ register_id, register_id + 1 };
            bin_exp->right_->Accept(this, &right_data);

            int dst_index = function->OpCodeSize();
            function->GetMutableInstruction(index)->RefillsBx(dst_index - index);

            return FillRemainRegisterNil(register_id + 1, end_register, line);
        }

        int left_register = 0;
        // Generate code to calculate left expression
        {
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            bin_exp->left_->Accept(this, &exp_var_data);
            left_register = register_id;
        }

        int right_register = 0;
        // Generate code to calculate right expression
        {
            if (end_register != EXP_VALUE_COUNT_ANY && register_id + 1 < end_register)
            {
                // If parent AST provide more than one register, then use the second
                // register as temp register of right expression
                ExpVarData exp_var_data{ register_id + 1, register_id + 2 };
                bin_exp->right_->Accept(this, &exp_var_data);
                right_register = register_id + 1;
            }
            else
            {
                // No more register, then generate a new register as temp register of
                // right expression
                REGISTER_GENERATOR_GUARD();
                right_register = GenerateRegisterId();
                ExpVarData exp_var_data{ right_register, right_register + 1 };
                bin_exp->right_->Accept(this, &exp_var_data);
            }
        }

        // Choose OpType by operator
        OpType op_type;
        switch (token) {
            case '+': op_type = OpType_Add; break;
            case '-': op_type = OpType_Sub; break;
            case '*': op_type = OpType_Mul; break;
            case '/': op_type = OpType_Div; break;
            case '^': op_type = OpType_Pow; break;
            case '%': op_type = OpType_Mod; break;
            case '<': op_type = OpType_Less; break;
            case '>': op_type = OpType_Greater; break;
            case Token_Concat: op_type = OpType_Concat; break;
            case Token_Equal: op_type = OpType_Equal; break;
            case Token_NotEqual: op_type = OpType_UnEqual; break;
            case Token_LessEqual: op_type = OpType_LessEqual; break;
            case Token_GreaterEqual: op_type = OpType_GreaterEqual; break;
            default: assert(0); break;
        }

        // Generate instruction to calculate
        auto instruction = Instruction::ABCCode(op_type, register_id++,
                                                left_register, right_register);
        function->AddInstruction(instruction, line);

        FillRemainRegisterNil(register_id, end_register, line);
    }